

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O3

err_t bignPubkeyVal(bign_params *params,octet *pubkey)

{
  size_t sVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  ec_o *ec;
  word *stack;
  word *a;
  
  bVar2 = memIsValid(params,0x150);
  if (bVar2 == 0) {
    eVar3 = 0x6d;
  }
  else {
    bVar2 = bignIsOperable(params);
    if (bVar2 == 0) {
      eVar3 = 0x1f6;
    }
    else {
      sVar4 = bignStart_keep(params->l,bignPubkeyVal_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar3 = 0x6e;
      }
      else {
        eVar3 = bignStart(ec,params);
        if (eVar3 == 0) {
          sVar4 = ec->f->n;
          sVar1 = ec->f->no;
          bVar2 = memIsValid(pubkey,sVar1 * 2);
          if (bVar2 == 0) {
            eVar3 = 0x6d;
          }
          else {
            a = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            stack = a + sVar4 * 2;
            bVar2 = (*ec->f->from)(a,pubkey,ec->f,stack);
            eVar3 = 0x1f9;
            if ((bVar2 != 0) &&
               (bVar2 = (*ec->f->from)(a + sVar4,pubkey + sVar1,ec->f,stack), bVar2 != 0)) {
              bVar2 = ecpIsOnA(a,ec,stack);
              eVar3 = 0x1f9;
              if (bVar2 != 0) {
                eVar3 = 0;
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bignPubkeyVal(const bign_params* params, const octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignPubkeyVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	stack = Q + 2 * n;
	// загрузить pt
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q \in ec?
	code = ecpIsOnA(Q, ec, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}